

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  PrefixUnaryExpressionSyntax *pPVar1;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000078;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000080;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  Token *args_1;
  __fn *args;
  
  args_1 = (Token *)__child_stack;
  args = __fn;
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000080,in_stack_00000078);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x59c674);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)__fn,(BumpAllocator *)__child_stack);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::PrefixUnaryExpressionSyntax,slang::syntax::SyntaxKind_const&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::ExpressionSyntax&>
                     (unaff_retaddr,(SyntaxKind *)args,args_1,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar2.info,TVar2._0_8_);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const PrefixUnaryExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<PrefixUnaryExpressionSyntax>(
        node.kind,
        node.operatorToken.deepClone(alloc),
        *deepClone(node.attributes, alloc),
        *deepClone<ExpressionSyntax>(*node.operand, alloc)
    );
}